

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktBuildPrograms.cpp
# Opt level: O3

void __thiscall vkt::anon_unknown_0::ValidateBinaryTask::execute(ValidateBinaryTask *this)

{
  bool bVar1;
  ostringstream validationLog;
  ostringstream aoStack_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream(aoStack_188);
  bVar1 = ::vk::validateProgram((this->m_program->binary).m_ptr,(ostream *)aoStack_188);
  this->m_program->validationStatus = bVar1 + STATUS_FAILED;
  std::__cxx11::ostringstream::~ostringstream(aoStack_188);
  std::ios_base::~ios_base(local_118);
  return;
}

Assistant:

void execute (void)
	{
		DE_ASSERT(m_program->buildStatus == Program::STATUS_PASSED);

		std::ostringstream validationLog;

		if (vk::validateProgram(*m_program->binary, &validationLog))
			m_program->validationStatus = Program::STATUS_PASSED;
		else
			m_program->validationStatus = Program::STATUS_FAILED;
	}